

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_calendar_records.c
# Opt level: O2

void CGTFS_RecordCalendarRecord(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined **ppuVar6;
  char *pcVar7;
  calendar_record_t *pcVar8;
  char **ppcVar9;
  byte bVar10;
  calendar_record_t a;
  char *field_values [10];
  char *field_names [10];
  
  bVar10 = 0;
  iVar1 = greatest_test_pre("calendar_record_read");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      iVar1 = -1;
      lVar4 = 10;
      puVar5 = &DAT_00221cc0;
      ppcVar9 = field_names;
      for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
        *ppcVar9 = (char *)*puVar5;
        puVar5 = puVar5 + (ulong)bVar10 * -2 + 1;
        ppcVar9 = ppcVar9 + (ulong)bVar10 * -2 + 1;
      }
      ppuVar6 = &PTR_anon_var_dwarf_2287_00221d10;
      ppcVar9 = field_values;
      for (; lVar4 != 0; lVar4 = lVar4 + -1) {
        *ppcVar9 = *ppuVar6;
        ppuVar6 = ppuVar6 + (ulong)bVar10 * -2 + 1;
        ppcVar9 = ppcVar9 + (ulong)bVar10 * -2 + 1;
      }
      read_calendar_record(&a,10,field_names,field_values);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar2 = greatest_do_assert_equal_t("1001",&a,&greatest_type_info_string,(void *)0x0);
      if (iVar2 == 0) {
        greatest_info.fail_line = 0x15;
        if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
LAB_0011f5d9:
          greatest_info.msg = "type_info->equal callback missing!";
        }
        else {
          greatest_info.msg = "\"1001\" != cr_1.service_id";
        }
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar2 = greatest_do_assert_equal_t
                          ("20000101",a.start_date,&greatest_type_info_string,(void *)0x0);
        if (iVar2 == 0) {
          greatest_info.fail_line = 0x16;
          if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_0011f5d9;
          greatest_info.msg = "\"20000101\" != cr_1.start_date";
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar2 = greatest_do_assert_equal_t
                            ("20201231",a.end_date,&greatest_type_info_string,(void *)0x0);
          if (iVar2 == 0) {
            greatest_info.fail_line = 0x17;
            if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_0011f5d9;
            greatest_info.msg = "\"20201231\" != cr_1.end_date";
          }
          else if (a.monday == SA_AVAILABLE) {
            if (a.tuesday == SA_AVAILABLE) {
              if (a.wednesday == SA_AVAILABLE) {
                if (a.thursday == SA_AVAILABLE) {
                  if (a.friday == SA_AVAILABLE) {
                    if (a.saturday == SA_UNAVAILABLE) {
                      greatest_info.assertions = greatest_info.assertions + 7;
                      if (a.sunday == SA_UNAVAILABLE) {
                        greatest_info.msg = (char *)0x0;
                        iVar1 = 0;
                        goto LAB_0011f6a1;
                      }
                      greatest_info.fail_line = 0x1e;
                      greatest_info.msg = "SA_UNAVAILABLE != cr_1.sunday";
                    }
                    else {
                      greatest_info.fail_line = 0x1d;
                      greatest_info.msg = "SA_UNAVAILABLE != cr_1.saturday";
                      greatest_info.assertions = greatest_info.assertions + 6;
                    }
                  }
                  else {
                    greatest_info.fail_line = 0x1c;
                    greatest_info.msg = "SA_AVAILABLE != cr_1.friday";
                    greatest_info.assertions = greatest_info.assertions + 5;
                  }
                }
                else {
                  greatest_info.fail_line = 0x1b;
                  greatest_info.msg = "SA_AVAILABLE != cr_1.thursday";
                  greatest_info.assertions = greatest_info.assertions + 4;
                }
              }
              else {
                greatest_info.fail_line = 0x1a;
                greatest_info.msg = "SA_AVAILABLE != cr_1.wednesday";
                greatest_info.assertions = greatest_info.assertions + 3;
              }
            }
            else {
              greatest_info.fail_line = 0x19;
              greatest_info.msg = "SA_AVAILABLE != cr_1.tuesday";
              greatest_info.assertions = greatest_info.assertions + 2;
            }
          }
          else {
            greatest_info.fail_line = 0x18;
            greatest_info.msg = "SA_AVAILABLE != cr_1.monday";
            greatest_info.assertions = greatest_info.assertions + 1;
          }
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_calendar_records.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011f82d;
    }
LAB_0011f6a1:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("calendar_record_compare");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    lVar4 = 0x1c;
    pcVar7 = "SOME_ID1";
    pcVar8 = &a;
    for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined4 *)pcVar8 = *(undefined4 *)pcVar7;
      pcVar7 = pcVar7 + ((ulong)bVar10 * -2 + 1) * 4;
      pcVar8 = (calendar_record_t *)((long)pcVar8 + ((ulong)bVar10 * -2 + 1) * 4);
    }
    pcVar7 = "SOME_ID1";
    pcVar8 = (calendar_record_t *)field_names;
    for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined4 *)pcVar8->service_id = *(undefined4 *)pcVar7;
      pcVar7 = pcVar7 + ((ulong)bVar10 * -2 + 1) * 4;
      pcVar8 = (calendar_record_t *)((long)pcVar8 + (ulong)bVar10 * -8 + 4);
    }
    pcVar7 = "SOME_ID1";
    ppcVar9 = field_values;
    for (; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined4 *)ppcVar9 = *(undefined4 *)pcVar7;
      pcVar7 = pcVar7 + ((ulong)bVar10 * -2 + 1) * 4;
      ppcVar9 = (char **)((long)ppcVar9 + (ulong)bVar10 * -8 + 4);
    }
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_calendar_record(&a,(calendar_record_t *)field_names);
    if (iVar1 == 1) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_calendar_record(&a,(calendar_record_t *)field_values);
      if (iVar1 == 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = equal_calendar_record
                          ((calendar_record_t *)field_names,(calendar_record_t *)field_values);
        if (iVar1 == 0) {
          greatest_info.msg = (char *)0x0;
          iVar1 = 0;
          goto LAB_0011f792;
        }
        greatest_info.fail_line = 0x4d;
        greatest_info.msg = "0 != equal_calendar_record(&b, &c)";
      }
      else {
        greatest_info.fail_line = 0x4c;
        greatest_info.msg = "0 != equal_calendar_record(&a, &c)";
      }
    }
    else {
      greatest_info.fail_line = 0x4b;
      greatest_info.msg = "1 != equal_calendar_record(&a, &b)";
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_calendar_records.c"
    ;
    if ((greatest_info.flags & 4) != 0) {
LAB_0011f82d:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_calendar_records.c"
      ;
      abort();
    }
    iVar1 = -1;
  }
LAB_0011f792:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_RecordCalendarRecord) {
    RUN_TEST(calendar_record_read);
    RUN_TEST(calendar_record_compare);
}